

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O1

void huc1_write_rom(Emulator *e,MaskedAddress addr,u8 value)

{
  CartInfo *pCVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  undefined7 in_register_00000011;
  undefined6 in_register_00000032;
  ulong uVar5;
  
  uVar5 = CONCAT62(in_register_00000032,addr) >> 0xd & 0x7ffff;
  if ((ushort)uVar5 < 4) {
    (*(code *)(&DAT_00110e40 + *(int *)(&DAT_00110e40 + uVar5 * 4)))
              (e,uVar5,CONCAT71(in_register_00000011,value),
               &DAT_00110e40 + *(int *)(&DAT_00110e40 + uVar5 * 4));
    return;
  }
  bVar2 = (e->state).memory_map_state.field_3.mbc1.byte_2000_3fff & 0x3f;
  bVar3 = 1;
  if (1 < bVar2) {
    bVar3 = bVar2;
  }
  bVar2 = (e->state).memory_map_state.field_3.mbc1.byte_4000_5fff;
  if ((e->state).memory_map_state.field_3.mbc1.bank_mode == BANK_MODE_ROM) {
    bVar3 = bVar2 << 6 | bVar3;
    uVar4 = 0;
  }
  else {
    uVar4 = (bVar2 & 3) << 0xd;
  }
  pCVar1 = e->cart_info;
  (e->state).memory_map_state.rom_base[1] =
       (s_rom_bank_count[pCVar1->rom_size] - 1 & (uint)bVar3) << 0xe;
  (e->state).memory_map_state.ext_ram_base = s_ext_ram_byte_size[pCVar1->ext_ram_size] - 1 & uVar4;
  return;
}

Assistant:

static void huc1_write_rom(Emulator* e, MaskedAddress addr, u8 value) {
  Huc1* huc1 = &MMAP_STATE.huc1;
  switch (addr >> 13) {
    case 0: /* 0000-1fff */
      MMAP_STATE.ext_ram_enabled =
          (value & MBC_RAM_ENABLED_MASK) == MBC_RAM_ENABLED_VALUE;
      break;
    case 1: /* 2000-3fff */
      huc1->byte_2000_3fff = value;
      break;
    case 2: /* 4000-5fff */
      huc1->byte_4000_5fff = value;
      break;
    case 3: /* 6000-7fff */
      huc1->bank_mode = (BankMode)(value & 1);
      break;
  }

  u16 rom1_bank = huc1->byte_2000_3fff & HUC1_ROM_BANK_LO_SELECT_MASK;
  if (rom1_bank == 0) {
    rom1_bank++;
  }

  u8 ext_ram_bank;
  if (huc1->bank_mode == BANK_MODE_ROM) {
    rom1_bank |= (huc1->byte_4000_5fff & HUC1_BANK_HI_SELECT_MASK)
                 << HUC1_BANK_HI_SHIFT;
    ext_ram_bank = 0;
  } else {
    ext_ram_bank = huc1->byte_4000_5fff & HUC1_BANK_HI_SELECT_MASK;
  }
  set_rom_bank(e, 1, rom1_bank);
  set_ext_ram_bank(e, ext_ram_bank);
}